

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdgen.c
# Opt level: O1

void cmdgen_progress_report_phase_complete(ProgressReceiver *prog)

{
  if ((linear_progress_phase) && (last_progress_col < 0x40)) {
    do {
      fputc(0x2b,(FILE *)progress_fp);
      last_progress_col = last_progress_col + 1;
    } while (last_progress_col < 0x40);
  }
  if (progress_fp != (FILE *)0x0) {
    fputc(10,(FILE *)progress_fp);
    fflush((FILE *)progress_fp);
    return;
  }
  return;
}

Assistant:

static void cmdgen_progress_report_phase_complete(ProgressReceiver *prog)
{
    if (linear_progress_phase)
        cmdgen_progress_report(prog, 1.0);
    if (progress_fp) {
        fputc('\n', progress_fp);
        fflush(progress_fp);
    }
}